

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O1

void (anonymous_namespace)::check<Imf_3_4::TiledInputFile,Imf_3_4::TiledOutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  size_t sVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  undefined4 *puVar6;
  undefined8 *puVar7;
  ostream *poVar8;
  TiledOutputFile file;
  Header f;
  undefined8 local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  long local_68 [2];
  TileDescription local_58 [3];
  
  local_98 = 0;
  Imf_3_4::Header::Header
            ((Header *)local_58,0x40,0x40,1.0,(Vec2 *)&local_98,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar5 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&local_98,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar5,(Channel *)"Dummy");
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001e8fb0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_001311cb;
    }
  }
  else {
LAB_001311cb:
    Imf_3_4::Header::setType((string *)local_58);
  }
  puVar6 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar6 = 2;
  local_98 = 0x2000000020;
  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Imf_3_4::Header::setTileDescription(local_58);
  remove("/var/tmp/badfile.exr");
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)&local_98,"/var/tmp/badfile.exr",(Header *)local_58,iVar3);
  Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&local_98);
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&local_98,"/var/tmp/badfile.exr",iVar3,true);
  sVar1 = inputtype->_M_string_length;
  iVar3 = (int)&local_98;
  if (sVar1 == DAT_001e8fb0) {
    if (sVar1 != 0) {
      iVar4 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar4 != 0) goto LAB_00131277;
    }
  }
  else {
LAB_00131277:
    Imf_3_4::MultiPartInputFile::header(iVar3);
    puVar7 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    sVar1 = puVar7[1];
    if (sVar1 == inputtype->_M_string_length) {
      if (sVar1 != 0) {
        iVar4 = bcmp((void *)*puVar7,(inputtype->_M_dataplus)._M_p,sVar1);
        if (iVar4 != 0) goto LAB_001312af;
      }
    }
    else {
LAB_001312af:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                          inputtype->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," but got ",9);
      Imf_3_4::MultiPartInputFile::header(iVar3);
      puVar7 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)*puVar7,puVar7[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," from multipart when input type was ",0x24);
      sVar1 = *(size_t *)(filename + 8);
      if (sVar1 == DAT_001e8fb0) {
        if (sVar1 != 0) {
          iVar4 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
          if (iVar4 != 0) goto LAB_00131351;
        }
        local_78 = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"unset","");
      }
      else {
LAB_00131351:
        local_78 = local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,*(long *)filename,sVar1 + *(long *)filename);
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_78,local_70);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
    }
  }
  sVar1 = inputtype->_M_string_length;
  if (sVar1 == DAT_001e8fb0) {
    if (sVar1 != 0) {
      iVar4 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar4 != 0) goto LAB_0013140c;
    }
  }
  else {
LAB_0013140c:
    Imf_3_4::MultiPartInputFile::header(iVar3);
    puVar7 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    sVar1 = puVar7[1];
    if (sVar1 != inputtype->_M_string_length) {
LAB_001316bf:
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_4::TiledInputFile, OUT = Imf_3_4::TiledOutputFile]"
                   );
    }
    if (sVar1 != 0) {
      iVar3 = bcmp((void *)*puVar7,(inputtype->_M_dataplus)._M_p,sVar1);
      if (iVar3 != 0) goto LAB_001316bf;
    }
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
  }
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&local_98,"/var/tmp/badfile.exr",iVar3);
  sVar1 = inputtype->_M_string_length;
  if (sVar1 == DAT_001e8fb0) {
    if (sVar1 != 0) {
      iVar3 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_001314a5;
    }
    Imf_3_4::TiledInputFile::header();
    cVar2 = Imf_3_4::Header::hasType();
    if (cVar2 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," type attribute got inserted when it shouldn\'t have been\n"
                 ,0x39);
    }
    Imf_3_4::TiledInputFile::header();
    cVar2 = Imf_3_4::Header::hasType();
    if (cVar2 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_4::TiledInputFile, OUT = Imf_3_4::TiledOutputFile]"
                   );
    }
    goto LAB_0013167f;
  }
LAB_001314a5:
  Imf_3_4::TiledInputFile::header();
  puVar7 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  sVar1 = puVar7[1];
  if (sVar1 == inputtype->_M_string_length) {
    if (sVar1 == 0) goto LAB_0013167f;
    iVar3 = bcmp((void *)*puVar7,(inputtype->_M_dataplus)._M_p,sVar1);
    if (iVar3 == 0) goto LAB_0013167f;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                      inputtype->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," but got ",9);
  Imf_3_4::TiledInputFile::header();
  puVar7 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)*puVar7,puVar7[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," when input type was ",0x15);
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001e8fb0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_00131583;
    }
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"unset","");
  }
  else {
LAB_00131583:
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,*(long *)filename,sVar1 + *(long *)filename);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_78,local_70);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
LAB_0013167f:
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
  }
  remove("/var/tmp/badfile.exr");
  Imf_3_4::Header::~Header((Header *)local_58);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}